

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload
          (IndirectDispatchCaseBufferUpload *this,TestContext *testCtx,DispatchCaseDesc *caseDesc,
          GLSLVersion glslVersion)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,caseDesc->m_name,&local_59)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,caseDesc->m_description,&local_5a);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IndirectDispatchCaseBufferUpload_00c06120;
  this->m_bufferSize = caseDesc->m_bufferSize;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_workGroupSize,&caseDesc->m_workGroupSize);
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::vector(&this->m_dispatchCommands,&caseDesc->m_dispatchCommands);
  this->m_glslVersion = GLSL_VERSION_310_ES;
  return;
}

Assistant:

IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload (tcu::TestContext&		testCtx,
																	const DispatchCaseDesc& caseDesc,
																	const glu::GLSLVersion	glslVersion)
	: vkt::TestCase			(testCtx, caseDesc.m_name, caseDesc.m_description)
	, m_bufferSize			(caseDesc.m_bufferSize)
	, m_workGroupSize		(caseDesc.m_workGroupSize)
	, m_dispatchCommands	(caseDesc.m_dispatchCommands)
	, m_glslVersion			(glslVersion)
{
}